

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_dec.c
# Opt level: O3

int pnm_getdata(jas_stream_t *in,pnm_hdr_t *hdr,jas_image_t *image,int allow_trunc)

{
  int iVar1;
  byte *pbVar2;
  jas_image_t *image_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  jas_matrix_t *pjVar6;
  ulong uVar7;
  ushort **ppuVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong local_90;
  int local_84;
  long local_80;
  undefined8 local_78;
  long local_70;
  int local_64;
  long local_60;
  long local_58 [3];
  jas_image_t *local_40;
  ulong local_38;
  
  local_84 = pnm_fmt((long)hdr->magic);
  local_64 = pnm_type((long)hdr->magic);
  if (local_64 == 0) {
    __assert_fail("type != PNM_TYPE_INVALID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/pnm/pnm_dec.c"
                  ,0x16f,"int pnm_getdata(jas_stream_t *, pnm_hdr_t *, jas_image_t *, int)");
  }
  iVar3 = pnm_maxvaltodepth((long)hdr->maxval);
  local_78 = CONCAT44(extraout_var,iVar3);
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  uVar7 = (ulong)(uint)hdr->numcmpts;
  if (0 < hdr->numcmpts) {
    lVar11 = 0;
    do {
      pjVar6 = jas_matrix_create(1,(long)hdr->width);
      local_58[lVar11] = (long)pjVar6;
      if (pjVar6 == (jas_matrix_t *)0x0) goto LAB_00135e85;
      lVar11 = lVar11 + 1;
      uVar7 = (ulong)hdr->numcmpts;
    } while (lVar11 < (long)uVar7);
  }
  if (hdr->height < 1) {
    uVar5 = 0;
  }
  else {
    local_40 = image;
    local_38 = (long)(1 << ((char)local_78 - 1U & 0x1f));
    local_80 = local_58[0];
    local_60 = 0;
    do {
      iVar3 = hdr->width;
      if (local_64 == 1) {
        if (local_84 == 1) {
          if (0 < iVar3) {
            iVar3 = 0;
            do {
              uVar5 = 0xffffffff;
              if ((in->flags_ & 7U) != 0) goto LAB_00135e90;
              if ((-1 < in->rwlimit_) && (in->rwlimit_ <= in->rwcnt_)) {
                in->flags_ = in->flags_ | 4;
                goto LAB_00135e90;
              }
              iVar1 = in->cnt_;
              in->cnt_ = iVar1 + -1;
              if (iVar1 < 1) {
                uVar4 = jas_stream_fillbuf(in,1);
                if (uVar4 == 0xffffffff) goto LAB_00135e90;
              }
              else {
                in->rwcnt_ = in->rwcnt_ + 1;
                pbVar2 = in->ptr_;
                in->ptr_ = pbVar2 + 1;
                uVar4 = (uint)*pbVar2;
              }
              iVar1 = hdr->width;
              lVar11 = (long)iVar3;
              iVar9 = iVar3 + 8;
              iVar10 = 0;
              do {
                if (iVar1 <= lVar11) {
                  iVar9 = iVar3 - iVar10;
                  break;
                }
                *(ulong *)(**(long **)(local_80 + 0x38) + lVar11 * 8) = (ulong)(-1 < (char)uVar4);
                uVar4 = uVar4 * 2;
                lVar11 = lVar11 + 1;
                iVar10 = iVar10 + -1;
              } while (iVar10 != -8);
              iVar3 = iVar9;
            } while (iVar9 < iVar1);
          }
        }
        else if (0 < iVar3) {
          lVar11 = 0;
          do {
            do {
              while (uVar5 = pnm_getc(in), uVar5 == 0x23) {
                do {
                  uVar5 = pnm_getc(in);
                  if (uVar5 == 0xffffffff) goto LAB_00135e90;
                } while (uVar5 != 10);
              }
              if (uVar5 == 0xffffffff) goto LAB_00135e90;
            } while ((uVar5 & 0xfffffffe) != 0x30);
            *(ulong *)(**(long **)(local_80 + 0x38) + lVar11 * 8) = (ulong)(0x31 - uVar5);
            lVar11 = lVar11 + 1;
          } while (lVar11 < hdr->width);
        }
      }
      else if (0 < iVar3) {
        local_70 = 0;
        do {
          if (0 < (int)uVar7) {
            lVar11 = 0;
            do {
              if (local_84 == 1) {
                if (hdr->sgnd == false) {
                  iVar3 = pnm_getuint(in,(int)local_78,&local_90);
                  goto LAB_00135d47;
                }
                iVar3 = pnm_getuint(in,(int)local_78,&local_90);
                if (iVar3 != 0) goto LAB_00135d4b;
                uVar7 = local_90;
                if ((local_38 & local_90) != 0) {
                  jas_eprintf("PNM decoder does not fully support signed data\n");
                  goto LAB_00135d4b;
                }
              }
              else {
                if (hdr->sgnd == false) {
                  do {
                    iVar3 = pnm_getc(in);
                    if (iVar3 == -1) goto LAB_00135d4b;
                    ppuVar8 = __ctype_b_loc();
                  } while ((*(byte *)((long)*ppuVar8 + (long)iVar3 * 2 + 1) & 0x20) != 0);
                  uVar7 = 0;
                  do {
                    if (((*ppuVar8)[iVar3] >> 0xb & 1) == 0) {
                      if (((*ppuVar8)[iVar3] >> 0xd & 1) != 0) goto LAB_00135d6e;
                      break;
                    }
                    uVar7 = ((long)iVar3 + uVar7 * 10) - 0x30;
                    iVar3 = pnm_getc(in);
                  } while (-1 < iVar3);
                  goto LAB_00135d4b;
                }
                iVar3 = pnm_getsintstr(in,(int_fast32_t *)&local_90);
LAB_00135d47:
                uVar7 = local_90;
                if (iVar3 != 0) {
LAB_00135d4b:
                  if (allow_trunc == 0) goto LAB_00135e85;
                  jas_eprintf("bad sample data\n");
                  uVar7 = 0;
                }
              }
LAB_00135d6e:
              *(ulong *)(**(long **)(local_58[lVar11] + 0x38) + local_70 * 8) = uVar7;
              lVar11 = lVar11 + 1;
              uVar7 = (ulong)hdr->numcmpts;
            } while (lVar11 < (long)uVar7);
            iVar3 = hdr->width;
          }
          local_70 = local_70 + 1;
        } while (local_70 < iVar3);
      }
      image_00 = local_40;
      lVar11 = local_60;
      uVar7 = (ulong)(uint)hdr->numcmpts;
      if (0 < hdr->numcmpts) {
        lVar12 = 0;
        do {
          iVar3 = jas_image_writecmpt(image_00,(uint)lVar12,0,lVar11,(long)hdr->width,1,
                                      (jas_matrix_t *)local_58[lVar12]);
          if (iVar3 != 0) goto LAB_00135e85;
          lVar12 = lVar12 + 1;
          uVar7 = (ulong)hdr->numcmpts;
        } while (lVar12 < (long)uVar7);
      }
      local_60 = lVar11 + 1;
      uVar5 = 0;
    } while (local_60 < hdr->height);
  }
LAB_00135e90:
  iVar3 = hdr->numcmpts;
  if (0 < iVar3) {
    lVar11 = 0;
    do {
      if ((jas_matrix_t *)local_58[lVar11] != (jas_matrix_t *)0x0) {
        jas_matrix_destroy((jas_matrix_t *)local_58[lVar11]);
        iVar3 = hdr->numcmpts;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar3);
  }
  return uVar5;
LAB_00135e85:
  uVar5 = 0xffffffff;
  goto LAB_00135e90;
}

Assistant:

static int pnm_getdata(jas_stream_t *in, pnm_hdr_t *hdr, jas_image_t *image,
  int allow_trunc)
{
	int ret;
#if 0
	int numcmpts;
#endif
	int cmptno;
	int fmt;
	jas_matrix_t *data[3];
	int x;
	int y;
	int_fast64_t v;
	int depth;
	int type;
	int c;
	int n;

	ret = -1;

#if 0
	numcmpts = jas_image_numcmpts(image);
#endif
	fmt = pnm_fmt(hdr->magic);
	type = pnm_type(hdr->magic);
	assert(type != PNM_TYPE_INVALID);
	depth = pnm_maxvaltodepth(hdr->maxval);

	data[0] = 0;
	data[1] = 0;
	data[2] = 0;
	for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
		if (!(data[cmptno] = jas_matrix_create(1, hdr->width))) {
			goto done;
		}
	}

	for (y = 0; y < hdr->height; ++y) {
		if (type == PNM_TYPE_PBM) {
			if (fmt == PNM_FMT_BIN) {
				for (x = 0; x < hdr->width;) {
					if ((c = jas_stream_getc(in)) == EOF) {
						goto done;
					}
					n = 8;
					while (n > 0 && x < hdr->width) {
						jas_matrix_set(data[0], 0, x, 1 - ((c >> 7) & 1));
						c <<= 1;
						--n;
						++x;
					}
				}
			} else {
				for (x = 0; x < hdr->width; ++x) {
					int uv;
					if (pnm_getbitstr(in, &uv)) {
						goto done;
					}
					jas_matrix_set(data[0], 0, x, 1 - uv);
				}
			}
		} else {
			for (x = 0; x < hdr->width; ++x) {
				for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
					if (fmt == PNM_FMT_BIN) {
						/* The sample data is in binary format. */
						if (hdr->sgnd) {
							/* The sample data is signed. */
							int_fast32_t sv;
							if (pnm_getsint(in, depth, &sv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								sv = 0;
							}
							v = sv;
						} else {
							/* The sample data is unsigned. */
							uint_fast32_t uv;
							if (pnm_getuint(in, depth, &uv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								uv = 0;
							}
							v = uv;
						}
					} else {
						/* The sample data is in text format. */
						if (hdr->sgnd) {
							/* The sample data is signed. */
							int_fast32_t sv;
							if (pnm_getsintstr(in, &sv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								sv = 0;
							}
							v = sv;
						} else {
							/* The sample data is unsigned. */
							uint_fast32_t uv;
							if (pnm_getuintstr(in, &uv)) {
								if (!allow_trunc) {
									goto done;
								}
								jas_eprintf("bad sample data\n");
								uv = 0;
							}
							v = uv;
						}
					}
					jas_matrix_set(data[cmptno], 0, x, v);
				}
			}
		}
		for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
			if (jas_image_writecmpt(image, cmptno, 0, y, hdr->width, 1,
			  data[cmptno])) {
				goto done;
			}
		}
	}

	ret = 0;

done:

	for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
		if (data[cmptno]) {
			jas_matrix_destroy(data[cmptno]);
		}
	}

	return ret;
}